

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O0

int sinc_hex_vari_process(SRC_PRIVATE *psrc,SRC_DATA *data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  SINC_FILTER *filter_00;
  long lVar4;
  long in_RSI;
  SINC_FILTER *in_RDI;
  float *output;
  double dVar5;
  double dVar6;
  int samples_in_hand;
  int half_filter_chan_len;
  increment_t start_filter_index;
  increment_t increment;
  double rem;
  double terminate;
  double float_increment;
  double count;
  double src_ratio;
  double input_index;
  SINC_FILTER *filter;
  double in_stack_ffffffffffffff68;
  SRC_DATA *in_stack_ffffffffffffff70;
  double local_70;
  double local_68;
  double local_38;
  double local_30;
  double scale;
  int local_4;
  
  if (in_RDI->out_gen == 0) {
    local_4 = 5;
  }
  else {
    scale = (double)in_RDI->out_gen;
    *(long *)((long)scale + 8) = *(long *)(in_RSI + 0x10) * (long)*(int *)((long)scale + 4);
    *(long *)((long)scale + 0x18) = *(long *)(in_RSI + 0x18) * (long)*(int *)((long)scale + 4);
    *(undefined8 *)((long)scale + 0x20) = 0;
    *(undefined8 *)((long)scale + 0x10) = 0;
    local_30 = *(double *)in_RDI;
    iVar2 = is_bad_src_ratio(local_30);
    if (iVar2 == 0) {
      local_38 = ((double)*(int *)((long)scale + 0x28) + 2.0) / (double)*(int *)((long)scale + 0x2c)
      ;
      if (*(double *)(in_RSI + 0x38) <= *(double *)in_RDI) {
        local_68 = *(double *)(in_RSI + 0x38);
      }
      else {
        local_68 = *(double *)in_RDI;
      }
      if (local_68 < 1.0) {
        if (*(double *)(in_RSI + 0x38) <= *(double *)in_RDI) {
          local_70 = *(double *)(in_RSI + 0x38);
        }
        else {
          local_70 = *(double *)in_RDI;
        }
        local_38 = local_38 / local_70;
      }
      filter_00 = (SINC_FILTER *)(long)*(int *)((long)scale + 4);
      lVar4 = lrint(local_38);
      iVar3 = (int)filter_00 * ((int)lVar4 + 1);
      dVar5 = (double)in_RDI->in_count;
      output = (float *)fmod_one(in_stack_ffffffffffffff68);
      iVar2 = *(int *)((long)scale + 0x48);
      iVar1 = *(int *)((long)scale + 4);
      lVar4 = lrint(dVar5 - (double)output);
      *(int *)((long)scale + 0x48) =
           (int)(((long)iVar2 + iVar1 * lVar4) % (long)*(int *)((long)scale + 0x54));
      dVar5 = 1.0 / local_30;
      while (*(long *)((long)scale + 0x20) < *(long *)((long)scale + 0x18)) {
        if (((*(int *)((long)scale + 0x4c) - *(int *)((long)scale + 0x48)) +
            *(int *)((long)scale + 0x54)) % *(int *)((long)scale + 0x54) <= iVar3) {
          iVar2 = prepare_data(filter_00,in_stack_ffffffffffffff70,
                               (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
          *(int *)&in_RDI->in_used = iVar2;
          if (iVar2 != 0) {
            return (int)in_RDI->in_used;
          }
          if (((*(int *)((long)scale + 0x4c) - *(int *)((long)scale + 0x48)) +
              *(int *)((long)scale + 0x54)) % *(int *)((long)scale + 0x54) <= iVar3) break;
        }
        if ((-1 < *(int *)((long)scale + 0x50)) &&
           ((double)*(int *)((long)scale + 0x50) <=
            (double)*(int *)((long)scale + 0x48) + (double)output + dVar5 + 1e-20)) break;
        if ((0 < *(long *)((long)scale + 0x18)) &&
           (1e-10 < ABS(*(double *)in_RDI - *(double *)(in_RSI + 0x38)))) {
          local_30 = *(double *)in_RDI +
                     ((double)*(long *)((long)scale + 0x20) *
                     (*(double *)(in_RSI + 0x38) - *(double *)in_RDI)) /
                     (double)*(long *)((long)scale + 0x18);
        }
        in_stack_ffffffffffffff70 = (SRC_DATA *)(double)*(int *)((long)scale + 0x2c);
        in_stack_ffffffffffffff68 = local_30;
        if (1.0 <= local_30) {
          in_stack_ffffffffffffff68 = 1.0;
        }
        double_to_fp(5.38256359402225e-318);
        double_to_fp(5.38268216977725e-318);
        calc_output_hex(in_RDI,(increment_t)((ulong)in_RSI >> 0x20),(increment_t)in_RSI,scale,output
                       );
        *(long *)((long)scale + 0x20) = *(long *)((long)scale + 0x20) + 6;
        dVar6 = 1.0 / local_30 + (double)output;
        output = (float *)fmod_one(in_stack_ffffffffffffff68);
        iVar2 = *(int *)((long)scale + 0x48);
        iVar1 = *(int *)((long)scale + 4);
        lVar4 = lrint(dVar6 - (double)output);
        *(int *)((long)scale + 0x48) =
             (int)(((long)iVar2 + iVar1 * lVar4) % (long)*(int *)((long)scale + 0x54));
      }
      in_RDI->in_count = (long)output;
      *(double *)in_RDI = local_30;
      *(long *)(in_RSI + 0x20) = *(long *)((long)scale + 0x10) / (long)*(int *)((long)scale + 4);
      *(long *)(in_RSI + 0x28) = *(long *)((long)scale + 0x20) / (long)*(int *)((long)scale + 4);
      local_4 = 0;
    }
    else {
      local_4 = 0x16;
    }
  }
  return local_4;
}

Assistant:

static int
sinc_hex_vari_process (SRC_PRIVATE *psrc, SRC_DATA *data)
{	SINC_FILTER *filter ;
	double		input_index, src_ratio, count, float_increment, terminate, rem ;
	increment_t	increment, start_filter_index ;
	int			half_filter_chan_len, samples_in_hand ;

	if (psrc->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	filter = (SINC_FILTER*) psrc->private_data ;

	/* If there is not a problem, this will be optimised out. */
	if (sizeof (filter->buffer [0]) != sizeof (data->data_in [0]))
		return SRC_ERR_SIZE_INCOMPATIBILITY ;

	filter->in_count = data->input_frames * filter->channels ;
	filter->out_count = data->output_frames * filter->channels ;
	filter->in_used = filter->out_gen = 0 ;

	src_ratio = psrc->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	/* Check the sample rate ratio wrt the buffer len. */
	count = (filter->coeff_half_len + 2.0) / filter->index_inc ;
	if (MIN (psrc->last_ratio, data->src_ratio) < 1.0)
		count /= MIN (psrc->last_ratio, data->src_ratio) ;

	/* Maximum coefficientson either side of center point. */
	half_filter_chan_len = filter->channels * (lrint (count) + 1) ;

	input_index = psrc->last_position ;
	float_increment = filter->index_inc ;

	rem = fmod_one (input_index) ;
	filter->b_current = (filter->b_current + filter->channels * lrint (input_index - rem)) % filter->b_len ;
	input_index = rem ;

	terminate = 1.0 / src_ratio + 1e-20 ;

	/* Main processing loop. */
	while (filter->out_gen < filter->out_count)
	{
		/* Need to reload buffer? */
		samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;

		if (samples_in_hand <= half_filter_chan_len)
		{	if ((psrc->error = prepare_data (filter, data, half_filter_chan_len)) != 0)
				return psrc->error ;

			samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;
			if (samples_in_hand <= half_filter_chan_len)
				break ;
			} ;

		/* This is the termination condition. */
		if (filter->b_real_end >= 0)
		{	if (filter->b_current + input_index + terminate >= filter->b_real_end)
				break ;
			} ;

		if (filter->out_count > 0 && fabs (psrc->last_ratio - data->src_ratio) > 1e-10)
			src_ratio = psrc->last_ratio + filter->out_gen * (data->src_ratio - psrc->last_ratio) / filter->out_count ;

		float_increment = filter->index_inc * (src_ratio < 1.0 ? src_ratio : 1.0) ;
		increment = double_to_fp (float_increment) ;

		start_filter_index = double_to_fp (input_index * float_increment) ;

		calc_output_hex (filter, increment, start_filter_index, float_increment / filter->index_inc, data->data_out + filter->out_gen) ;
		filter->out_gen += 6 ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		filter->b_current = (filter->b_current + filter->channels * lrint (input_index - rem)) % filter->b_len ;
		input_index = rem ;
		} ;

	psrc->last_position = input_index ;

	/* Save current ratio rather then target ratio. */
	psrc->last_ratio = src_ratio ;

	data->input_frames_used = filter->in_used / filter->channels ;
	data->output_frames_gen = filter->out_gen / filter->channels ;

	return SRC_ERR_NO_ERROR ;
}